

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O0

int main(void)

{
  pointer pCVar1;
  pointer pCVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  undefined1 local_f8 [8];
  Printer printer_1;
  ComponentPtr componentTree;
  Printer printer;
  unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_> local_c8;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_c0;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_b8;
  unsigned_long_long local_b0;
  unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_> local_a8;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_a0;
  unsigned_long_long local_98;
  unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_> local_90;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_88;
  unsigned_long_long local_80;
  unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> local_78;
  unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> composite4;
  unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> local_68;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_60 [3];
  unsigned_long_long local_48;
  unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_> local_40;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_38;
  undefined1 local_30 [8];
  Composite composite;
  
  Kompositum::Composite::Composite((Composite *)local_30,1);
  local_48 = 2;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>((Kompositum *)&local_40,&local_48);
  std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
  unique_ptr<Kompositum::Leaf,std::default_delete<Kompositum::Leaf>,void>
            ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)
             &local_38,&local_40);
  Kompositum::Composite::addChild((Composite *)local_30,(ComponentPtr *)&local_38);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            (&local_38);
  std::unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_>::~unique_ptr(&local_40);
  composite4._M_t.
  super___uniq_ptr_impl<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>._M_t.
  super__Tuple_impl<0UL,_Kompositum::Composite_*,_std::default_delete<Kompositum::Composite>_>.
  super__Head_base<0UL,_Kompositum::Composite_*,_false>._M_head_impl =
       (__uniq_ptr_data<Kompositum::Composite,_std::default_delete<Kompositum::Composite>,_true,_true>
        )(__uniq_ptr_impl<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>)0x3;
  Kompositum::make_unique<Kompositum::Composite,unsigned_long_long>
            ((Kompositum *)&local_68,(unsigned_long_long *)&composite4);
  std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
  unique_ptr<Kompositum::Composite,std::default_delete<Kompositum::Composite>,void>
            ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)
             local_60,&local_68);
  Kompositum::Composite::addChild((Composite *)local_30,(ComponentPtr *)local_60);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            (local_60);
  std::unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>::~unique_ptr
            (&local_68);
  local_80 = 4;
  Kompositum::make_unique<Kompositum::Composite,unsigned_long_long>
            ((Kompositum *)&local_78,&local_80);
  pCVar1 = std::unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>::
           operator->(&local_78);
  local_98 = 5;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>((Kompositum *)&local_90,&local_98);
  std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
  unique_ptr<Kompositum::Leaf,std::default_delete<Kompositum::Leaf>,void>
            ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)
             &local_88,&local_90);
  Kompositum::Composite::addChild(pCVar1,(ComponentPtr *)&local_88);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            (&local_88);
  std::unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_>::~unique_ptr(&local_90);
  pCVar1 = std::unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>::
           operator->(&local_78);
  local_b0 = 6;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>((Kompositum *)&local_a8,&local_b0);
  std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
  unique_ptr<Kompositum::Leaf,std::default_delete<Kompositum::Leaf>,void>
            ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)
             &local_a0,&local_a8);
  Kompositum::Composite::addChild(pCVar1,(ComponentPtr *)&local_a0);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            (&local_a0);
  std::unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_>::~unique_ptr(&local_a8);
  std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
  unique_ptr<Kompositum::Composite,std::default_delete<Kompositum::Composite>,void>
            ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)
             &local_b8,&local_78);
  Kompositum::Composite::addChild((Composite *)local_30,(ComponentPtr *)&local_b8);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            (&local_b8);
  printer.indent = 7;
  printer._12_4_ = 0;
  Kompositum::make_unique<Kompositum::Leaf,unsigned_long_long>
            ((Kompositum *)&local_c8,(unsigned_long_long *)&printer.indent);
  std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>::
  unique_ptr<Kompositum::Leaf,std::default_delete<Kompositum::Leaf>,void>
            ((unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>> *)
             &local_c0,&local_c8);
  Kompositum::Composite::addChild((Composite *)local_30,(ComponentPtr *)&local_c0);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            (&local_c0);
  std::unique_ptr<Kompositum::Leaf,_std::default_delete<Kompositum::Leaf>_>::~unique_ptr(&local_c8);
  Kompositum::Printer::Printer((Printer *)&componentTree);
  Kompositum::Composite::accept((Composite *)local_30,(int)(Printer *)&componentTree,__addr,in_RCX);
  Kompositum::Printer::~Printer((Printer *)&componentTree);
  Kompositum::buildComposite((Kompositum *)&printer_1.indent,1,&kTreeDef);
  Kompositum::Printer::Printer((Printer *)local_f8);
  pCVar2 = std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::
           operator->((unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
                       *)&printer_1.indent);
  (*pCVar2->_vptr_Component[2])(pCVar2,(Printer *)local_f8);
  Kompositum::Printer::~Printer((Printer *)local_f8);
  std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>::~unique_ptr
            ((unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &printer_1.indent);
  std::unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_>::~unique_ptr
            (&local_78);
  Kompositum::Composite::~Composite((Composite *)local_30);
  return 0;
}

Assistant:

int main(void) {
    Composite composite(1);

    composite.addChild(make_unique<Leaf>(2ull));
    composite.addChild(make_unique<Composite>(3ull));

    auto composite4 = make_unique<Composite>(4ull);
    composite4->addChild(make_unique<Leaf>(5ull));
    composite4->addChild(make_unique<Leaf>(6ull));

    composite.addChild(std::move(composite4));

    composite.addChild(make_unique<Leaf>(7ull));

    {
        Printer printer;
        composite.accept(printer);
    }

    auto componentTree = buildComposite(1, kTreeDef);

    {
        Printer printer;
        componentTree->accept(printer);
    }
}